

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

bool QObject::disconnectImpl
               (QObject *sender,void **signal,QObject *receiver,void **slot,
               QMetaObject *senderMetaObject)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  QMetaObjectPrivate *pQVar4;
  char *pcVar5;
  long in_RCX;
  long in_RDX;
  QMetaObject *in_RSI;
  undefined8 *in_RDI;
  QMetaObject *in_R8;
  long in_FS_OFFSET;
  QObject *unaff_retaddr;
  int signal_index;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  void *args [2];
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  Call in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  bool local_81;
  QMessageLogger local_80;
  undefined1 local_5c [36];
  undefined1 *local_38;
  undefined1 *local_30;
  void **in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  QObject *in_stack_ffffffffffffffe8;
  QMetaObject *in_stack_fffffffffffffff0;
  long lVar6;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI == (undefined8 *)0x0) || ((in_RDX == 0 && (in_RCX != 0)))) {
    lcConnect();
    anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffd8), bVar2) {
      anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f9b28);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_R8,
                 (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff44,
                 (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (char *)0x3f9b3e);
      QMessageLogger::warning
                ((QMessageLogger *)(local_5c + 4),
                 "QObject::disconnect: Unexpected nullptr parameter");
    }
    local_81 = false;
  }
  else {
    local_5c._0_4_ = -1;
    if (in_RSI != (QMetaObject *)0x0) {
      in_stack_ffffffffffffffe8 = (QObject *)local_5c;
      while( true ) {
        uVar1 = in_stack_ffffffffffffff4c & 0xffffff;
        if (in_R8 != (QMetaObject *)0x0) {
          uVar1 = CONCAT13((int)local_5c._0_4_ < 0,(int3)in_stack_ffffffffffffff4c);
        }
        in_stack_ffffffffffffff4c = uVar1;
        in_stack_fffffffffffffff0 = in_RSI;
        if (((char)(in_stack_ffffffffffffff4c >> 0x18) == '\0') ||
           ((QMetaObject::static_metacall
                       ((QMetaObject *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                        ,in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,
                        (void **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)),
            -1 < (int)local_5c._0_4_ &&
            (in_stack_ffffffffffffff48 = local_5c._0_4_, pQVar4 = QMetaObjectPrivate::get(in_R8),
            in_stack_fffffffffffffff0 = in_RSI, in_stack_ffffffffffffff48 < pQVar4->signalCount))))
        break;
        in_R8 = QMetaObject::superClass((QMetaObject *)0x3f9c21);
      }
      if (in_R8 == (QMetaObject *)0x0) {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        lcConnect();
        anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                  );
        while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_38), bVar2) {
          anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f9c87);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_R8,
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     in_stack_ffffffffffffff44,
                     (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (char *)0x3f9c9d);
          (**(code **)*in_RDI)();
          pcVar5 = QMetaObject::className
                             ((QMetaObject *)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          QMessageLogger::warning(&local_80,"QObject::disconnect: signal not found in %s",pcVar5);
          local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
        }
        local_81 = false;
        goto LAB_003f9d1a;
      }
      iVar3 = QMetaObjectPrivate::signalOffset
                        ((QMetaObject *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      local_5c._0_4_ = iVar3 + local_5c._0_4_;
    }
    local_81 = QMetaObjectPrivate::disconnect
                         (unaff_retaddr,(int)((ulong)lVar6 >> 0x20),in_stack_fffffffffffffff0,
                          in_stack_ffffffffffffffe8,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                          in_stack_ffffffffffffffd8,(DisconnectType)args[0]);
  }
LAB_003f9d1a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return local_81;
}

Assistant:

bool QObject::disconnectImpl(const QObject *sender, void **signal, const QObject *receiver, void **slot, const QMetaObject *senderMetaObject)
{
    if (sender == nullptr || (receiver == nullptr && slot != nullptr)) {
        qCWarning(lcConnect, "QObject::disconnect: Unexpected nullptr parameter");
        return false;
    }

    int signal_index = -1;
    if (signal) {
        void *args[] = { &signal_index, signal };
        for (; senderMetaObject && signal_index < 0; senderMetaObject = senderMetaObject->superClass()) {
            senderMetaObject->static_metacall(QMetaObject::IndexOfMethod, 0, args);
            if (signal_index >= 0 && signal_index < QMetaObjectPrivate::get(senderMetaObject)->signalCount)
                break;
        }
        if (!senderMetaObject) {
            qCWarning(lcConnect, "QObject::disconnect: signal not found in %s", sender->metaObject()->className());
            return false;
        }
        signal_index += QMetaObjectPrivate::signalOffset(senderMetaObject);
    }

    return QMetaObjectPrivate::disconnect(sender, signal_index, senderMetaObject, receiver, -1, slot);
}